

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int str_byte(lua_State *L)

{
  lua_State *L_00;
  lua_Integer lVar1;
  ptrdiff_t pVar2;
  lua_State *L_01;
  lua_State *in_RDI;
  int i;
  int n;
  ptrdiff_t pose;
  ptrdiff_t posi;
  char *s;
  size_t l;
  int local_38;
  size_t *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  int narg;
  lua_State *in_stack_ffffffffffffffe0;
  lua_State *local_18;
  int local_4;
  
  narg = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  L_00 = (lua_State *)luaL_checklstring(in_stack_ffffffffffffffe0,narg,in_stack_ffffffffffffffd0);
  lVar1 = luaL_optinteger(L_00,narg,(lua_Integer)in_stack_ffffffffffffffd0);
  pVar2 = posrelat(lVar1,(size_t)local_18);
  lVar1 = luaL_optinteger(L_00,(int)((ulong)pVar2 >> 0x20),(lua_Integer)in_stack_ffffffffffffffd0);
  L_01 = (lua_State *)posrelat(lVar1,(size_t)local_18);
  if (pVar2 < 1) {
    pVar2 = 1;
  }
  if (local_18 < L_01) {
    L_01 = local_18;
  }
  if ((long)L_01 < pVar2) {
    local_4 = 0;
  }
  else {
    local_4 = ((int)L_01 - (int)pVar2) + 1;
    if (pVar2 + local_4 <= (long)L_01) {
      luaL_error(in_RDI,"string slice too long");
    }
    luaL_checkstack(L_01,local_4,(char *)0x11da6c);
    for (local_38 = 0; local_38 < local_4; local_38 = local_38 + 1) {
      lua_pushinteger(in_RDI,(ulong)*(byte *)((long)L_00 + pVar2 + local_38 + -1));
    }
  }
  return local_4;
}

Assistant:

static int str_byte(lua_State*L){
size_t l;
const char*s=luaL_checklstring(L,1,&l);
ptrdiff_t posi=posrelat(luaL_optinteger(L,2,1),l);
ptrdiff_t pose=posrelat(luaL_optinteger(L,3,posi),l);
int n,i;
if(posi<=0)posi=1;
if((size_t)pose>l)pose=l;
if(posi>pose)return 0;
n=(int)(pose-posi+1);
if(posi+n<=pose)
luaL_error(L,"string slice too long");
luaL_checkstack(L,n,"string slice too long");
for(i=0;i<n;i++)
lua_pushinteger(L,uchar(s[posi+i-1]));
return n;
}